

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# upnpapi.c
# Opt level: O0

int UpnpSetMaxSubscriptionTimeOut(UpnpDevice_Handle Hnd,int MaxSubscriptionTimeOut)

{
  Upnp_Handle_Type UVar1;
  Handle_Info *local_20;
  Handle_Info *SInfo;
  UpnpDevice_Handle local_10;
  int MaxSubscriptionTimeOut_local;
  UpnpDevice_Handle Hnd_local;
  
  local_20 = (Handle_Info *)0x0;
  if (UpnpSdkInit == 1) {
    SInfo._4_4_ = MaxSubscriptionTimeOut;
    local_10 = Hnd;
    UpnpPrintf(UPNP_ALL,API,".upnp/src/api/upnpapi.c",0x86e,"Inside UpnpSetMaxSubscriptionTimeOut\n"
              );
    HandleLock(".upnp/src/api/upnpapi.c",0x871);
    UVar1 = GetHandleInfo(local_10,&local_20);
    if (UVar1 == HND_DEVICE) {
      if ((SInfo._4_4_ == -1) || (-1 < SInfo._4_4_)) {
        local_20->MaxSubscriptionTimeOut = SInfo._4_4_;
        HandleUnlock(".upnp/src/api/upnpapi.c",0x881);
        UpnpPrintf(UPNP_ALL,API,".upnp/src/api/upnpapi.c",0x886,
                   "Exiting UpnpSetMaxSubscriptionTimeOut\n");
        MaxSubscriptionTimeOut_local = 0;
      }
      else {
        HandleUnlock(".upnp/src/api/upnpapi.c",0x87c);
        MaxSubscriptionTimeOut_local = -100;
      }
    }
    else {
      HandleUnlock(".upnp/src/api/upnpapi.c",0x877);
      MaxSubscriptionTimeOut_local = -100;
    }
  }
  else {
    MaxSubscriptionTimeOut_local = -0x74;
  }
  return MaxSubscriptionTimeOut_local;
}

Assistant:

int UpnpSetMaxSubscriptionTimeOut(
	UpnpDevice_Handle Hnd, int MaxSubscriptionTimeOut)
{
	struct Handle_Info *SInfo = NULL;

	if (UpnpSdkInit != 1) {
		return UPNP_E_FINISH;
	}

	UpnpPrintf(UPNP_ALL,
		API,
		__FILE__,
		__LINE__,
		"Inside UpnpSetMaxSubscriptionTimeOut\n");

	HandleLock(__FILE__, __LINE__);

	switch (GetHandleInfo(Hnd, &SInfo)) {
	case HND_DEVICE:
		break;
	default:
		HandleUnlock(__FILE__, __LINE__);
		return UPNP_E_INVALID_HANDLE;
	}
	if ((MaxSubscriptionTimeOut != UPNP_INFINITE) &&
		(MaxSubscriptionTimeOut < 0)) {
		HandleUnlock(__FILE__, __LINE__);
		return UPNP_E_INVALID_HANDLE;
	}

	SInfo->MaxSubscriptionTimeOut = MaxSubscriptionTimeOut;
	HandleUnlock(__FILE__, __LINE__);

	UpnpPrintf(UPNP_ALL,
		API,
		__FILE__,
		__LINE__,
		"Exiting UpnpSetMaxSubscriptionTimeOut\n");

	return UPNP_E_SUCCESS;
}